

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *
mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::get
          (MPI_Datatype *dt,int *k)

{
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this;
  iterator iVar1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar2;
  mapped_type *pmVar3;
  out_of_range *poVar4;
  int flag;
  function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *result;
  
  std::mutex::lock((mutex *)attr_map<int,std::function<void(void*,void*,int*,ompi_datatype_t**)>>::
                            mut()::m);
  this = &keymap()->_M_t;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::find(this,k);
  pmVar2 = keymap();
  if ((_Rb_tree_header *)iVar1._M_node == &(pmVar2->_M_t)._M_impl.super__Rb_tree_header) {
    poVar4 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar4,"Key not mapped.");
    __cxa_throw(poVar4,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pmVar2 = keymap();
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](pmVar2,k);
  MPI_Type_get_attr(*dt,*pmVar3,&result,&flag);
  if (flag != 0) {
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               attr_map<int,std::function<void(void*,void*,int*,ompi_datatype_t**)>>::mut()::m);
    return result;
  }
  poVar4 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(poVar4,"Key not mapped.");
  __cxa_throw(poVar4,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

static T& get(const MPI_Datatype& dt, const K& k) {
        std::lock_guard<std::mutex> lock(mut());
        if (keymap().find(k) == keymap().end()) {
            throw std::out_of_range("Key not mapped.");
        }
        int key = keymap()[k];
        T* result;
        int flag;
        MPI_Type_get_attr(dt, key, &result, &flag);
        if (!flag) {
            throw std::out_of_range("Key not mapped.");
        }
        return *result;
    }